

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O3

void __thiscall cmLocalNinjaGenerator::Generate(cmLocalNinjaGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *this_00;
  pointer pcVar3;
  pointer ppcVar4;
  cmGeneratorTarget *this_01;
  bool bVar5;
  int iVar6;
  TargetType TVar7;
  string *psVar8;
  string *remote_path;
  ostream *poVar9;
  cmNinjaTargetGenerator *pcVar10;
  pointer ppcVar11;
  string showIncludesPrefix;
  string local_68;
  string local_48;
  
  psVar8 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  remote_path = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmLocalGenerator::MaybeConvertToRelativePath
            (&local_48,(cmLocalGenerator *)this,psVar8,remote_path);
  std::__cxx11::string::operator=((string *)&this->HomeRelativeOutputPath,(string *)&local_48);
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  iVar6 = std::__cxx11::string::compare((char *)&this->HomeRelativeOutputPath);
  if (iVar6 == 0) {
    (this->HomeRelativeOutputPath)._M_string_length = 0;
    *(this->HomeRelativeOutputPath)._M_dataplus._M_p = '\0';
  }
  WriteProcessedMakefile
            (this,(ostream *)
                  (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                  _vptr_cmGlobalGenerator);
  bVar5 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
  if (bVar5) {
    WriteBuildFileTop(this);
    WritePools(this,(ostream *)
                    (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                    TryCompileTimeout.__r);
    this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    paVar2 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"CMAKE_CL_SHOWINCLUDES_PREFIX","");
    psVar8 = cmMakefile::GetSafeDefinition(this_00,&local_68);
    pcVar3 = (psVar8->_M_dataplus)._M_p;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar3,pcVar3 + psVar8->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_48._M_string_length != 0) {
      poVar9 = (ostream *)
               (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
               TryCompileTimeout.__r;
      local_68._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"localized /showIncludes string","");
      cmGlobalNinjaGenerator::WriteComment(poVar9,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      poVar9 = (ostream *)
               (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
               TryCompileTimeout.__r;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"msvc_deps_prefix = ",0x13);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_48._M_dataplus._M_p,local_48._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n\n",2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  ppcVar4 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar11 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppcVar11 != ppcVar4;
      ppcVar11 = ppcVar11 + 1) {
    this_01 = *ppcVar11;
    TVar7 = cmGeneratorTarget::GetType(this_01);
    if (TVar7 != INTERFACE_LIBRARY) {
      pcVar10 = cmNinjaTargetGenerator::New(this_01);
      if (pcVar10 != (cmNinjaTargetGenerator *)0x0) {
        (*(pcVar10->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[3])(pcVar10);
        bVar5 = cmGlobalGenerator::IsExcluded
                          ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                           GlobalGenerator,this_01);
        if (!bVar5) {
          cmGlobalNinjaGenerator::AddDependencyToAll
                    ((cmGlobalNinjaGenerator *)
                     (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
                     this_01);
        }
        (*(pcVar10->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[1])(pcVar10);
      }
    }
  }
  WriteCustomCommandBuildStatements(this);
  return;
}

Assistant:

void cmLocalNinjaGenerator::Generate()
{
  // Compute the path to use when referencing the current output
  // directory from the top output directory.
  this->HomeRelativeOutputPath = this->MaybeConvertToRelativePath(
    this->GetBinaryDirectory(), this->GetCurrentBinaryDirectory());
  if (this->HomeRelativeOutputPath == ".") {
    this->HomeRelativeOutputPath.clear();
  }

  this->WriteProcessedMakefile(this->GetBuildFileStream());
#ifdef NINJA_GEN_VERBOSE_FILES
  this->WriteProcessedMakefile(this->GetRulesFileStream());
#endif

  // We do that only once for the top CMakeLists.txt file.
  if (this->IsRootMakefile()) {
    this->WriteBuildFileTop();

    this->WritePools(this->GetRulesFileStream());

    const std::string showIncludesPrefix =
      this->GetMakefile()->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
    if (!showIncludesPrefix.empty()) {
      cmGlobalNinjaGenerator::WriteComment(this->GetRulesFileStream(),
                                           "localized /showIncludes string");
      this->GetRulesFileStream()
        << "msvc_deps_prefix = " << showIncludesPrefix << "\n\n";
    }
  }

  const std::vector<cmGeneratorTarget*>& targets = this->GetGeneratorTargets();
  for (cmGeneratorTarget* target : targets) {
    if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    cmNinjaTargetGenerator* tg = cmNinjaTargetGenerator::New(target);
    if (tg) {
      tg->Generate();
      // Add the target to "all" if required.
      if (!this->GetGlobalNinjaGenerator()->IsExcluded(target)) {
        this->GetGlobalNinjaGenerator()->AddDependencyToAll(target);
      }
      delete tg;
    }
  }

  this->WriteCustomCommandBuildStatements();
}